

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O3

Action __thiscall
psy::C::SyntaxDumper::visitFieldDesignator(SyntaxDumper *this,FieldDesignatorSyntax *node)

{
  SyntaxToken local_50;
  
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->dotTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->identTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitFieldDesignator(const FieldDesignatorSyntax* node) override
    {
        terminal(node->dotToken(), node);
        terminal(node->identifierToken(), node);
        return Action::Skip;
    }